

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CheckerMemberVisitor::handle
          (CheckerMemberVisitor *this,HierarchicalValueExpression *expr)

{
  Scope *pSVar1;
  CheckerInstanceBodySymbol *pCVar2;
  CheckerInstanceBodySymbol *pCVar3;
  ValueSymbol *pVVar4;
  Diagnostic *this_00;
  ValueSymbol *pVVar5;
  CheckerInstanceBodySymbol *pCVar6;
  
  pVVar4 = (expr->super_ValueExpressionBase).symbol;
  pVVar5 = pVVar4;
  do {
    pSVar1 = (pVVar5->super_Symbol).parentScope;
    if (pSVar1 == (Scope *)0x0) {
      return;
    }
    pVVar5 = (ValueSymbol *)pSVar1->thisSym;
    if ((pVVar5->super_Symbol).kind != StatementBlock) {
      return;
    }
  } while ((pVVar5->declaredType).flags.m_bits == 0);
  pCVar2 = this->body;
  pCVar6 = pCVar2;
  if (pCVar2 != (CheckerInstanceBodySymbol *)0x0) {
    pCVar6 = (CheckerInstanceBodySymbol *)&pCVar2->super_Scope;
  }
  do {
    pCVar3 = (CheckerInstanceBodySymbol *)(pVVar4->super_Symbol).parentScope;
    if (pCVar3 == (CheckerInstanceBodySymbol *)0x0) break;
    if (pCVar3 == pCVar6) {
      return;
    }
    pVVar4 = (ValueSymbol *)(pCVar3->super_Symbol).name._M_len;
  } while ((pVVar4->super_Symbol).kind != InstanceBody);
  this_00 = Scope::addDiag(&pCVar2->super_Scope,(DiagCode)0x3b0007,
                           (expr->super_ValueExpressionBase).super_Expression.sourceRange);
  Diagnostic::addNote(this_00,(DiagCode)0x50001,
                      (((expr->super_ValueExpressionBase).symbol)->super_Symbol).location);
  return;
}

Assistant:

void handle(const HierarchicalValueExpression& expr) {
        bool inForkJoin = false;
        auto scope = expr.symbol.getParentScope();
        while (scope) {
            auto& sym = scope->asSymbol();
            if (sym.kind != SymbolKind::StatementBlock)
                break;

            if (sym.as<StatementBlockSymbol>().blockKind != StatementBlockKind::Sequential) {
                inForkJoin = true;
                break;
            }

            scope = sym.getParentScope();
        }

        if (inForkJoin && !isFromChecker(expr.symbol)) {
            auto& diag = body.addDiag(diag::CheckerForkJoinRef, expr.sourceRange);
            diag.addNote(diag::NoteDeclarationHere, expr.symbol.location);
            return;
        }

        visitDefault(expr);
    }